

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-table.c
# Opt level: O2

_Bool Curl_uint_tbl_add(uint_tbl *tbl,void *entry,uint *pkey)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  long lVar6;
  void **ppvVar7;
  ulong uVar5;
  
  if (pkey != (uint *)0x0 && entry != (void *)0x0) {
    *pkey = 0xffffffff;
    uVar1 = tbl->nrows;
    uVar2 = tbl->nentries;
    if (uVar2 != uVar1) {
      uVar4 = tbl->last_key_added;
      if (uVar1 <= tbl->last_key_added) {
        uVar4 = uVar1;
      }
      uVar5 = (ulong)(uVar4 + 1);
      lVar6 = uVar5 * 8;
      for (uVar3 = uVar5; uVar3 < uVar1; uVar3 = uVar3 + 1) {
        if (*(long *)((long)tbl->rows + lVar6) == 0) {
          ppvVar7 = (void **)((long)tbl->rows + lVar6);
          goto LAB_0015b68a;
        }
        lVar6 = lVar6 + 8;
      }
      for (uVar3 = 0; uVar3 != uVar5; uVar3 = uVar3 + 1) {
        if (tbl->rows[uVar3] == (void *)0x0) {
          ppvVar7 = tbl->rows + uVar3;
LAB_0015b68a:
          *ppvVar7 = entry;
          tbl->nentries = uVar2 + 1;
          tbl->last_key_added = (uint)uVar3;
          *pkey = (uint)uVar3;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool Curl_uint_tbl_add(struct uint_tbl *tbl, void *entry, unsigned int *pkey)
{
  unsigned int key, start_pos;

  DEBUGASSERT(tbl->init == CURL_UINT_TBL_MAGIC);
  if(!entry || !pkey)
    return FALSE;
  *pkey = UINT_MAX; /* always invalid */
  if(tbl->nentries == tbl->nrows)  /* full */
    return FALSE;

  start_pos = CURLMIN(tbl->last_key_added, tbl->nrows) + 1;
  for(key = start_pos; key < tbl->nrows; ++key) {
    if(!tbl->rows[key]) {
      tbl->rows[key] = entry;
      tbl->nentries++;
      tbl->last_key_added = key;
      *pkey = key;
      return TRUE;
    }
  }
  /* no free entry at or above tbl->maybe_next_key, wrap around */
  for(key = 0; key < start_pos; ++key) {
    if(!tbl->rows[key]) {
      tbl->rows[key] = entry;
      tbl->nentries++;
      tbl->last_key_added = key;
      *pkey = key;
      return TRUE;
    }
  }
  /* Did not find any free row? Should not happen */
  DEBUGASSERT(0);
  return FALSE;
}